

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

ssize_t __thiscall Matrix::read(Matrix *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  long lVar2;
  int *sizes;
  long lVar3;
  undefined4 in_register_00000034;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  shared_array<double> local_38;
  
  lVar4 = CONCAT44(in_register_00000034,__fd);
  uVar5 = (ulong)*(uint *)(lVar4 + 0xd8);
  uVar6 = 1;
  if (uVar5 != 1) {
    uVar6 = (ulong)(*(uint *)(lVar4 + 0xd8) - 1);
  }
  sizes = (int *)operator_new__(uVar6 * 4);
  *sizes = 1;
  if (1 < uVar5) {
    lVar2 = *(long *)(lVar4 + 0xc0);
    lVar3 = 0;
    do {
      sizes[lVar3] = *(int *)(lVar2 + 4 + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (uVar5 - 1 != lVar3);
  }
  local_38.px = *(double **)(lVar4 + 0xa8);
  iVar1 = **(int **)(lVar4 + 200);
  lVar2 = *(long *)(lVar4 + 0xa0);
  local_38.pn.pi_ = *(sp_counted_base **)(lVar4 + 0xb0);
  if (local_38.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_38.pn.pi_)->use_count_ = (local_38.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  Matrix(this,(double *)((long)(int)__buf * (long)iVar1 * 8 + lVar2),&local_38,sizes,(int)uVar6);
  boost::detail::shared_count::~shared_count(&local_38.pn);
  return (ssize_t)this;
}

Assistant:

const Matrix Matrix::read(int i) const
{
    uint dimension = uint(nMatrixDimension==1 ? 1 : nMatrixDimension-1);
    int *sizes = new int[dimension];
    sizes[0] = 1;
    for (uint s=1; s<uint(nMatrixDimension); s++)
         sizes[s-1] = pSize[s];
    return Matrix( &(pData[i*pMult[0]]), matrixParent, sizes, dimension );
}